

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall CVmBigNumCache::CVmBigNumCache(CVmBigNumCache *this,size_t max_regs)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  CVmBigNumCacheReg *p;
  long local_20;
  CVmBigNumCacheReg *local_18;
  
  pvVar1 = malloc(in_RSI * 0x18);
  *in_RDI = pvVar1;
  in_RDI[0x15] = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  local_18 = (CVmBigNumCacheReg *)*in_RDI;
  for (local_20 = in_RSI; local_20 != 0; local_20 = local_20 + -1) {
    CVmBigNumCacheReg::clear(local_18);
    local_18->nxt_ = (CVmBigNumCacheReg *)in_RDI[2];
    in_RDI[2] = local_18;
    local_18 = local_18 + 1;
  }
  CVmBigNumCacheReg::clear((CVmBigNumCacheReg *)(in_RDI + 3));
  CVmBigNumCacheReg::clear((CVmBigNumCacheReg *)(in_RDI + 6));
  CVmBigNumCacheReg::clear((CVmBigNumCacheReg *)(in_RDI + 9));
  CVmBigNumCacheReg::clear((CVmBigNumCacheReg *)(in_RDI + 0xc));
  CVmBigNumCacheReg::clear((CVmBigNumCacheReg *)(in_RDI + 0xf));
  CVmBigNumCacheReg::clear((CVmBigNumCacheReg *)(in_RDI + 0x12));
  return;
}

Assistant:

CVmBigNumCache::CVmBigNumCache(size_t max_regs)
{
    CVmBigNumCacheReg *p;
    size_t i;

    /* allocate our register array */
    reg_ = (CVmBigNumCacheReg *)t3malloc(max_regs * sizeof(reg_[0]));

    /* remember the number of registers */
    max_regs_ = max_regs;

    /* clear the list heads */
    free_reg_ = 0;
    unalloc_reg_ = 0;

    /* we haven't actually allocated any registers yet - clear them out */
    for (p = reg_, i = max_regs ; i != 0 ; ++p, --i)
    {
        /* clear this register descriptor */
        p->clear();

        /* link it into the unallocated list */
        p->nxt_ = unalloc_reg_;
        unalloc_reg_ = p;
    }

    /* we haven't allocated the constants registers yet */
    ln10_.clear();
    ln2_.clear();
    pi_.clear();
    e_.clear();
    dbl_max_.clear();
    dbl_min_.clear();
}